

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::ComputeAllImmediateRewards
          (BayesianGameForDecPOMDPStage *this,FactoredDecPOMDPDiscreteInterface *fd)

{
  size_t sVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  reference pvVar3;
  long in_RDI;
  BayesianGameBase *this_00;
  vector<double,_std::allocator<double>_> *pvVar4;
  Index jaI;
  Index jtI;
  size_t nrJA;
  size_t nrJT;
  size_type in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff58;
  allocator_type *__a;
  size_t __n;
  uint local_78;
  uint local_74;
  allocator_type local_6d [21];
  undefined8 local_58;
  Index in_stack_ffffffffffffffb8;
  Index in_stack_ffffffffffffffbc;
  BayesianGameForDecPOMDPStage *in_stack_ffffffffffffffc0;
  
  if ((*(byte *)(in_RDI + 0x130) & 1) != 0) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)0x8b721e);
  }
  this_00 = (BayesianGameBase *)(in_RDI + 0x20);
  sVar1 = BayesianGameBase::GetNrJointTypes(this_00);
  pvVar2 = (vector<double,_std::allocator<double>_> *)BayesianGameBase::GetNrJointActions(this_00);
  local_58 = 0;
  __n = sVar1;
  pvVar4 = pvVar2;
  std::allocator<double>::allocator((allocator<double> *)0x8b727d);
  std::vector<double,_std::allocator<double>_>::vector
            (pvVar4,__n,(value_type_conflict3 *)this_00,in_stack_ffffffffffffff58);
  __a = local_6d;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x8b72a7);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)pvVar4,__n,(value_type *)this_00,__a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)this_00,
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)__a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)this_00);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x8b72f5);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x8b7309);
  for (local_74 = 0; local_74 < sVar1; local_74 = local_74 + 1) {
    for (local_78 = 0; (vector<double,_std::allocator<double>_> *)(ulong)local_78 < pvVar2;
        local_78 = local_78 + 1) {
      pvVar4 = (vector<double,_std::allocator<double>_> *)
               ComputeImmediateReward
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)pvVar4,in_stack_ffffffffffffff48);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(pvVar4,in_stack_ffffffffffffff48);
      *pvVar3 = (value_type)pvVar4;
    }
  }
  *(undefined1 *)(in_RDI + 0x130) = 1;
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::
ComputeAllImmediateRewards(const FactoredDecPOMDPDiscreteInterface *fd)
{
    if(_m_areCachedImmediateRewards)
        _m_immR.clear();

    size_t nrJT = GetNrJointTypes();
    size_t nrJA = GetNrJointActions();
    _m_immR = vector< vector <double> >(nrJT, vector<double>(nrJA, 0.0) );

    for(Index jtI=0; jtI< nrJT; jtI++)
        for(Index jaI=0; jaI< nrJA; jaI++)
            _m_immR.at(jtI).at(jaI) = ComputeImmediateReward(jtI, jaI);

    _m_areCachedImmediateRewards = true;
}